

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_ptr.hpp
# Opt level: O0

void __thiscall
duckdb::unique_ptr<unsigned_long[],std::default_delete<unsigned_long>,false>::
unique_ptr<unsigned_long*,std::default_delete<unsigned_long[]>,void,bool>
          (unique_ptr<unsigned_long[],_std::default_delete<unsigned_long>,_false> *this,
          unsigned_long *param_2)

{
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> *in_RSI;
  unsigned_long *in_stack_ffffffffffffffe8;
  
  std::unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>>::
  unique_ptr<unsigned_long*,std::default_delete<unsigned_long[]>,void,bool>
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static inline void AssertNotNull(const bool null) {
#if defined(DUCKDB_DEBUG_NO_SAFETY) || defined(DUCKDB_CLANG_TIDY)
		return;
#else
		if (DUCKDB_UNLIKELY(null)) {
			throw duckdb::InternalException("Attempted to dereference unique_ptr that is NULL!");
		}
#endif
	}